

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGccDepfileReader.cxx
# Opt level: O0

cmGccDepfileContent *
anon_unknown.dwarf_603c3::readPlainDepfile
          (cmGccDepfileContent *__return_storage_ptr__,char *filePath)

{
  byte bVar1;
  bool bVar2;
  pointer *local_308;
  string local_2e8 [32];
  pointer *local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dst;
  byte local_289;
  undefined1 local_288 [7];
  bool readingRules;
  cmGccStyleDependency dep;
  string line;
  istream local_228 [8];
  ifstream is;
  char *filePath_local;
  cmGccDepfileContent *result;
  
  std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::vector
            (__return_storage_ptr__);
  std::ifstream::ifstream(local_228,filePath,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string
              ((string *)
               &dep.paths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmGccStyleDependency::cmGccStyleDependency((cmGccStyleDependency *)local_288);
    local_289 = 1;
    while (bVar2 = cmsys::SystemTools::GetLineFromStream
                             (local_228,
                              (string *)
                              &dep.paths.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)0x0,
                              0xffffffffffffffff), bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &dep.paths.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,"--RULES--");
      if (bVar2) {
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_288);
        if (!bVar2) {
          std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::push_back
                    (__return_storage_ptr__,(value_type *)local_288);
          memset(&dst,0,0x30);
          cmGccStyleDependency::cmGccStyleDependency((cmGccStyleDependency *)&dst);
          cmGccStyleDependency::operator=
                    ((cmGccStyleDependency *)local_288,(cmGccStyleDependency *)&dst);
          cmGccStyleDependency::~cmGccStyleDependency((cmGccStyleDependency *)&dst);
        }
        local_289 = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&dep.paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                "--DEPENDENCIES--");
        if (bVar2) {
          local_289 = 0;
        }
        else {
          if ((local_289 & 1) == 0) {
            local_308 = &dep.rules.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_308 = (pointer *)local_288;
          }
          local_2c8 = local_308;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_308,
                      (value_type *)
                      &dep.paths.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::string(local_2e8);
          std::__cxx11::string::operator=
                    ((string *)
                     &dep.paths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_2e8);
          std::__cxx11::string::~string(local_2e8);
        }
      }
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288);
    if (!bVar2) {
      std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::push_back
                (__return_storage_ptr__,(value_type *)local_288);
    }
    cmGccStyleDependency::~cmGccStyleDependency((cmGccStyleDependency *)local_288);
    std::__cxx11::string::~string
              ((string *)
               &dep.paths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

cmGccDepfileContent readPlainDepfile(const char* filePath)
{
  cmGccDepfileContent result;
  cmsys::ifstream is(filePath);
  if (!is.is_open())
    return result;
  std::string line;

  cmGccStyleDependency dep;
  bool readingRules = true;
  while (cmSystemTools::GetLineFromStream(is, line)) {
    if (line == "--RULES--") {
      if (!dep.rules.empty()) {
        result.push_back(std::move(dep));
        dep = cmGccStyleDependency();
      }
      readingRules = true;
    } else if (line == "--DEPENDENCIES--") {
      readingRules = false;
    } else {
      std::vector<std::string>& dst = readingRules ? dep.rules : dep.paths;
      dst.push_back(std::move(line));
      line = std::string();
    }
  }

  if (!dep.rules.empty()) {
    result.push_back(std::move(dep));
  }

  return result;
}